

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcoll.c
# Opt level: O3

int main(void)

{
  int iVar1;
  ulong in_RAX;
  char empty [1];
  undefined8 uStack_8;
  
  uStack_8 = in_RAX & 0xffffffffffffff;
  iVar1 = strcmp((char *)((long)&uStack_8 + 7),"abcde");
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcoll.c, line %d - %s\n"
           ,0x20,"strcmp( empty, abcde ) < 0");
  }
  iVar1 = strcmp("abcde",(char *)((long)&uStack_8 + 7));
  if (iVar1 < 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcoll.c, line %d - %s\n"
           ,0x21,"strcmp( abcde, empty ) > 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char cmpabcde[] = "abcde";
    char empty[] = "";
    TESTCASE( strcmp( abcde, cmpabcde ) == 0 );
    TESTCASE( strcmp( abcde, abcdx ) < 0 );
    TESTCASE( strcmp( abcdx, abcde ) > 0 );
    TESTCASE( strcmp( empty, abcde ) < 0 );
    TESTCASE( strcmp( abcde, empty ) > 0 );
    return TEST_RESULTS;
}